

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_libc.cc
# Opt level: O0

absolute_lookup * __thiscall
absl::lts_20240722::time_internal::cctz::TimeZoneLibC::BreakTime
          (absolute_lookup *__return_storage_ptr__,TimeZoneLibC *this,time_point<seconds> *tp)

{
  char *pcVar1;
  long lVar2;
  civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag> cVar3;
  char *local_e8;
  tm *local_e0;
  absolute_lookup *al;
  civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag> local_b0;
  long local_a0;
  year_t year;
  undefined8 local_90;
  tm *local_88;
  tm *tmp;
  tm tm;
  time_t t;
  undefined8 local_38;
  int_least64_t local_30;
  undefined8 local_28;
  int_fast64_t s;
  time_point<seconds> *tp_local;
  TimeZoneLibC *this_local;
  
  time_zone::absolute_lookup::absolute_lookup(__return_storage_ptr__);
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->is_dst = false;
  __return_storage_ptr__->abbr = "-00";
  pcVar1 = (char *)ToUnixSeconds(tp);
  lVar2 = std::numeric_limits<long>::min();
  if ((long)pcVar1 < lVar2) {
    cVar3 = detail::civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>::min();
    local_30 = cVar3.f_.y;
    (__return_storage_ptr__->cs).f_.y = local_30;
    local_28 = cVar3.f_._8_8_;
    (__return_storage_ptr__->cs).f_.m = (undefined1)local_28;
    (__return_storage_ptr__->cs).f_.d = local_28._1_1_;
    (__return_storage_ptr__->cs).f_.hh = local_28._2_1_;
    (__return_storage_ptr__->cs).f_.mm = local_28._3_1_;
    (__return_storage_ptr__->cs).f_.ss = local_28._4_1_;
    *(undefined3 *)&(__return_storage_ptr__->cs).f_.field_0xd = local_28._5_3_;
  }
  else {
    lVar2 = std::numeric_limits<long>::max();
    if (lVar2 < (long)pcVar1) {
      cVar3 = detail::civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>::max()
      ;
      t = cVar3.f_.y;
      (__return_storage_ptr__->cs).f_.y = t;
      local_38 = cVar3.f_._8_8_;
      (__return_storage_ptr__->cs).f_.m = (undefined1)local_38;
      (__return_storage_ptr__->cs).f_.d = local_38._1_1_;
      (__return_storage_ptr__->cs).f_.hh = local_38._2_1_;
      (__return_storage_ptr__->cs).f_.mm = local_38._3_1_;
      (__return_storage_ptr__->cs).f_.ss = local_38._4_1_;
      *(undefined3 *)&(__return_storage_ptr__->cs).f_.field_0xd = local_38._5_3_;
    }
    else {
      tm.tm_zone = pcVar1;
      if ((this->local_ & 1U) == 0) {
        local_e0 = anon_unknown_10::gm_time((time_t *)&tm.tm_zone,(tm *)&tmp);
      }
      else {
        local_e0 = anon_unknown_10::local_time((time_t *)&tm.tm_zone,(tm *)&tmp);
      }
      local_88 = local_e0;
      if (local_e0 == (tm *)0x0) {
        if ((long)pcVar1 < 0) {
          _year = (fields)detail::
                          civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>::
                          min();
        }
        else {
          _year = (fields)detail::
                          civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>::
                          max();
        }
        (__return_storage_ptr__->cs).f_.y = year;
        (__return_storage_ptr__->cs).f_.m = (undefined1)local_90;
        (__return_storage_ptr__->cs).f_.d = local_90._1_1_;
        (__return_storage_ptr__->cs).f_.hh = local_90._2_1_;
        (__return_storage_ptr__->cs).f_.mm = local_90._3_1_;
        (__return_storage_ptr__->cs).f_.ss = local_90._4_1_;
        *(undefined3 *)&(__return_storage_ptr__->cs).f_.field_0xd = local_90._5_3_;
      }
      else {
        local_a0 = (long)local_e0->tm_year + 0x76c;
        detail::civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>::civil_time
                  (&local_b0,local_a0,(long)(local_e0->tm_mon + 1),(long)local_e0->tm_mday,
                   (long)local_e0->tm_hour,(long)local_e0->tm_min,(long)local_e0->tm_sec);
        (__return_storage_ptr__->cs).f_.y = local_b0.f_.y;
        (__return_storage_ptr__->cs).f_.m = local_b0.f_.m;
        (__return_storage_ptr__->cs).f_.d = local_b0.f_.d;
        (__return_storage_ptr__->cs).f_.hh = local_b0.f_.hh;
        (__return_storage_ptr__->cs).f_.mm = local_b0.f_.mm;
        (__return_storage_ptr__->cs).f_.ss = local_b0.f_.ss;
        *(undefined3 *)&(__return_storage_ptr__->cs).f_.field_0xd = local_b0.f_._13_3_;
        lVar2 = anon_unknown_10::tm_gmtoff<tm>(local_88);
        __return_storage_ptr__->offset = (int)lVar2;
        if ((this->local_ & 1U) == 0) {
          local_e8 = "UTC";
        }
        else {
          local_e8 = anon_unknown_10::tm_zone<tm>(local_88);
        }
        __return_storage_ptr__->abbr = local_e8;
        __return_storage_ptr__->is_dst = 0 < local_88->tm_isdst;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

time_zone::absolute_lookup TimeZoneLibC::BreakTime(
    const time_point<seconds>& tp) const {
  time_zone::absolute_lookup al;
  al.offset = 0;
  al.is_dst = false;
  al.abbr = "-00";

  const std::int_fast64_t s = ToUnixSeconds(tp);

  // If std::time_t cannot hold the input we saturate the output.
  if (s < std::numeric_limits<std::time_t>::min()) {
    al.cs = civil_second::min();
    return al;
  }
  if (s > std::numeric_limits<std::time_t>::max()) {
    al.cs = civil_second::max();
    return al;
  }

  const std::time_t t = static_cast<std::time_t>(s);
  std::tm tm;
  std::tm* tmp = local_ ? local_time(&t, &tm) : gm_time(&t, &tm);

  // If std::tm cannot hold the result we saturate the output.
  if (tmp == nullptr) {
    al.cs = (s < 0) ? civil_second::min() : civil_second::max();
    return al;
  }

  const year_t year = tmp->tm_year + year_t{1900};
  al.cs = civil_second(year, tmp->tm_mon + 1, tmp->tm_mday, tmp->tm_hour,
                       tmp->tm_min, tmp->tm_sec);
  al.offset = static_cast<int>(tm_gmtoff(*tmp));
  al.abbr = local_ ? tm_zone(*tmp) : "UTC";  // as expected by cctz
  al.is_dst = tmp->tm_isdst > 0;
  return al;
}